

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * ghc::filesystem::absolute(path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  error_category *peVar4;
  int *piVar5;
  ulong uVar6;
  path *result_2;
  char cVar7;
  char *pcVar8;
  ulong uVar9;
  path result_1;
  path base;
  path result;
  path local_108;
  path local_e8;
  path local_c8;
  path local_a8;
  path local_88;
  path local_68;
  path local_48;
  
  peVar4 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar4;
  current_path(&local_e8,ec);
  if (ec->_M_value != 0) {
    piVar5 = __errno_location();
    ec->_M_value = *piVar5;
    ec->_M_cat = peVar4;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    goto LAB_00105b3b;
  }
  uVar6 = (p->_path)._M_string_length;
  if (uVar6 == 0) {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_e8._path._M_dataplus._M_p,
               local_e8._path._M_dataplus._M_p + local_e8._path._M_string_length);
    path::operator/=(__return_storage_ptr__,p);
    goto LAB_00105b3b;
  }
  if (uVar6 < 3) {
    uVar6 = 0;
LAB_00105c69:
    if ((p->_path)._M_dataplus._M_p[uVar6] == '/') {
LAB_00105ced:
      path::root_name(&local_108,&local_e8);
      (__return_storage_ptr__->_path)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_path).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_108._path._M_dataplus._M_p,
                 local_108._path._M_dataplus._M_p + local_108._path._M_string_length);
      path::operator/=(__return_storage_ptr__,p);
      local_a8._path._M_dataplus._M_p = local_108._path._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._path._M_dataplus._M_p == &local_108._path.field_2) goto LAB_00105b3b;
LAB_00105d37:
      operator_delete(local_a8._path._M_dataplus._M_p,
                      local_108._path.field_2._M_allocated_capacity + 1);
      goto LAB_00105b3b;
    }
  }
  else {
    pcVar8 = (p->_path)._M_dataplus._M_p;
    cVar7 = (char)p;
    if ((((*pcVar8 == '/') && (pcVar8[1] == '/')) && (pcVar8[2] != 0x2f)) &&
       (iVar3 = isprint((int)pcVar8[2]), iVar3 != 0)) {
      uVar6 = std::__cxx11::string::find(cVar7,0x2f);
      uVar9 = (p->_path)._M_string_length;
      if (uVar6 == 0xffffffffffffffff) {
        uVar6 = uVar9;
      }
      if (uVar6 != 0) {
        if (uVar9 < 3) {
          uVar6 = 0;
LAB_00105d46:
          if ((uVar6 < uVar9) && (pcVar8 = (p->_path)._M_dataplus._M_p, pcVar8[uVar6] == '/')) {
LAB_00105d55:
            (__return_storage_ptr__->_path)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->_path).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,pcVar8,pcVar8 + uVar9);
            goto LAB_00105b3b;
          }
        }
        else {
          pcVar8 = (p->_path)._M_dataplus._M_p;
          if (*pcVar8 == '/') {
            if (((pcVar8[1] == '/') && (pcVar8[2] != 0x2f)) &&
               (iVar3 = isprint((int)pcVar8[2]), iVar3 != 0)) {
              uVar6 = std::__cxx11::string::find(cVar7,0x2f);
              uVar9 = (p->_path)._M_string_length;
              if (uVar6 == 0xffffffffffffffff) {
                uVar6 = uVar9;
              }
              goto LAB_00105d46;
            }
            goto LAB_00105d55;
          }
        }
        path::root_name(&local_a8,p);
        path::root_directory(&local_48,&local_e8);
        paVar1 = &local_c8._path.field_2;
        local_c8._path._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,local_a8._path._M_dataplus._M_p,
                   local_a8._path._M_dataplus._M_p + local_a8._path._M_string_length);
        path::operator/=(&local_c8,&local_48);
        path::relative_path(&local_68,&local_e8);
        paVar2 = &local_108._path.field_2;
        local_108._path._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,local_c8._path._M_dataplus._M_p,
                   local_c8._path._M_dataplus._M_p + local_c8._path._M_string_length);
        path::operator/=(&local_108,&local_68);
        path::relative_path(&local_88,p);
        (__return_storage_ptr__->_path)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_path).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_108._path._M_dataplus._M_p,
                   local_108._path._M_dataplus._M_p + local_108._path._M_string_length);
        path::operator/=(__return_storage_ptr__,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._path._M_dataplus._M_p != &local_88._path.field_2) {
          operator_delete(local_88._path._M_dataplus._M_p,
                          local_88._path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._path._M_dataplus._M_p != paVar2) {
          operator_delete(local_108._path._M_dataplus._M_p,
                          local_108._path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._path._M_dataplus._M_p != &local_68._path.field_2) {
          operator_delete(local_68._path._M_dataplus._M_p,
                          local_68._path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._path._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._path._M_dataplus._M_p,
                          local_c8._path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._path._M_dataplus._M_p != &local_48._path.field_2) {
          operator_delete(local_48._path._M_dataplus._M_p,
                          local_48._path.field_2._M_allocated_capacity + 1);
        }
        local_108._path.field_2._M_allocated_capacity = local_a8._path.field_2._M_allocated_capacity
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._path._M_dataplus._M_p == &local_a8._path.field_2) goto LAB_00105b3b;
        goto LAB_00105d37;
      }
      if (2 < uVar9) goto LAB_00105c7e;
      uVar6 = 0;
LAB_00105cbc:
      if (uVar6 < uVar9) goto LAB_00105c69;
    }
    else {
LAB_00105c7e:
      pcVar8 = (p->_path)._M_dataplus._M_p;
      if (*pcVar8 == '/') {
        if (((pcVar8[1] == '/') && (pcVar8[2] != 0x2f)) &&
           (iVar3 = isprint((int)pcVar8[2]), iVar3 != 0)) {
          uVar6 = std::__cxx11::string::find(cVar7,0x2f);
          uVar9 = (p->_path)._M_string_length;
          if (uVar6 == 0xffffffffffffffff) {
            uVar6 = uVar9;
          }
          goto LAB_00105cbc;
        }
        goto LAB_00105ced;
      }
    }
  }
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_e8._path._M_dataplus._M_p,
             local_e8._path._M_dataplus._M_p + local_e8._path._M_string_length);
  path::operator/=(__return_storage_ptr__,p);
LAB_00105b3b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._path._M_dataplus._M_p != &local_e8._path.field_2) {
    operator_delete(local_e8._path._M_dataplus._M_p,local_e8._path.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path absolute(const path& p, std::error_code& ec)
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (p.empty()) {
        return absolute(current_path(ec), ec) / "";
    }
    ULONG size = ::GetFullPathNameW(GHC_NATIVEWP(p), 0, 0, 0);
    if (size) {
        std::vector<wchar_t> buf(size, 0);
        ULONG s2 = GetFullPathNameW(GHC_NATIVEWP(p), size, buf.data(), nullptr);
        if (s2 && s2 < size) {
            path result = path(std::wstring(buf.data(), s2));
            if (p.filename() == ".") {
                result /= ".";
            }
            return result;
        }
    }
    ec = detail::make_system_error();
    return path();
#else
    path base = current_path(ec);
    if (!ec) {
        if (p.empty()) {
            return base / p;
        }
        if (p.has_root_name()) {
            if (p.has_root_directory()) {
                return p;
            }
            else {
                return p.root_name() / base.root_directory() / base.relative_path() / p.relative_path();
            }
        }
        else {
            if (p.has_root_directory()) {
                return base.root_name() / p;
            }
            else {
                return base / p;
            }
        }
    }
    ec = detail::make_system_error();
    return path();
#endif
}